

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCPUWarmup.cpp
# Opt level: O1

void tcu::warmupCPU(void)

{
  int i_1;
  deUint64 dVar1;
  deUint64 dVar2;
  int iVar3;
  int iVar4;
  int iVar6;
  int i;
  long lVar7;
  int measurementNdx;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  deInt64 times [3];
  float absoluteDeviations [5];
  float local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  float fStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined1 local_80 [8];
  uint local_78 [2];
  float fStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  uint local_48 [2];
  float fStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  int iVar5;
  
  local_b0 = *warmupCPUInternal::g_dummy;
  iVar6 = 1;
  do {
    if (0x3fffffff < iVar6) break;
    lVar7 = 0;
    do {
      dVar1 = deGetMicroseconds();
      if (iVar6 < 1) {
        fVar12 = 123.0;
      }
      else {
        iVar4 = 0x7b;
        iVar8 = 0;
        do {
          iVar10 = 4;
          do {
            local_b0 = cosf((float)iVar4 + local_b0);
            iVar3 = (int)(local_b0 * 10.0);
            iVar5 = -iVar3;
            if (0 < iVar3) {
              iVar5 = iVar3;
            }
            iVar4 = iVar5 + ((iVar4 + 0x3f) / 0x6b) * -0x6b + iVar4 + 0x3f;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar6);
        fVar12 = (float)iVar4;
      }
      local_b0 = local_b0 + fVar12;
      dVar2 = deGetMicroseconds();
      *(deUint64 *)(local_78 + lVar7 * 2) = dVar2 - dVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_98 = CONCAT44(uStack_64,local_68);
    local_a8 = local_78[0];
    uStack_a4 = local_78[1];
    fStack_a0 = fStack_70;
    uStack_9c = uStack_6c;
    std::__insertion_sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(&local_a8,&uStack_90);
    iVar6 = iVar6 << (CONCAT44(uStack_9c,fStack_a0) < 10000);
  } while (CONCAT44(uStack_9c,fStack_a0) < 10000);
  uVar9 = 0;
  do {
    if (4 < uVar9) {
      local_88 = local_58;
      local_98 = CONCAT44(uStack_64,local_68);
      uStack_90 = uStack_60;
      uStack_8c = uStack_5c;
      local_a8 = local_78[0];
      uStack_a4 = local_78[1];
      fStack_a0 = fStack_70;
      uStack_9c = uStack_6c;
      std::__insertion_sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(&local_a8,local_80);
      fVar12 = (float)local_98;
      lVar7 = 0;
      do {
        fVar13 = (float)*(long *)(local_78 + lVar7 * 2) - fVar12;
        uVar11 = -(uint)(-fVar13 <= fVar13);
        local_48[lVar7] = ~uVar11 & (uint)-fVar13 | (uint)fVar13 & uVar11;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      local_98 = CONCAT44(local_98._4_4_,local_38);
      local_a8 = local_48[0];
      uStack_a4 = local_48[1];
      fStack_a0 = fStack_40;
      uStack_9c = uStack_3c;
      std::__insertion_sort<float*,__gnu_cxx::__ops::_Iter_less_iter>(&local_a8,(long)&local_98 + 4)
      ;
      if (fStack_a0 / fVar12 <= 0.05) break;
    }
    dVar1 = deGetMicroseconds();
    if (iVar6 < 1) {
      fVar12 = 123.0;
    }
    else {
      iVar4 = 0x7b;
      iVar8 = 0;
      do {
        iVar10 = 4;
        do {
          local_b0 = cosf((float)iVar4 + local_b0);
          iVar3 = (int)(local_b0 * 10.0);
          iVar5 = -iVar3;
          if (0 < iVar3) {
            iVar5 = iVar3;
          }
          iVar4 = iVar5 + ((iVar4 + 0x3f) / 0x6b) * -0x6b + iVar4 + 0x3f;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar6);
      fVar12 = (float)iVar4;
    }
    local_b0 = local_b0 + fVar12;
    dVar2 = deGetMicroseconds();
    *(deUint64 *)(local_78 + (ulong)(uVar9 % 5) * 2) = dVar2 - dVar1;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x32);
  *warmupCPUInternal::g_dummy = local_b0;
  return;
}

Assistant:

void warmupCPU (void)
{
	float	dummy				= *warmupCPUInternal::g_dummy.m_v;
	int		computationSize		= 1;

	// Do a rough calibration for computationSize to get dummyComputation's running time above a certain threshold.
	while (computationSize < 1<<30) // \note This condition is unlikely to be met. The "real" loop exit is the break below.
	{
		const float		singleMeasurementThreshold	= 10000.0f;
		const int		numMeasurements				= 3;
		deInt64			times[numMeasurements];

		for (int i = 0; i < numMeasurements; i++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			times[i] = (deInt64)(deGetMicroseconds() - startTime);
		}

		if (floatMedian(times) >= singleMeasurementThreshold)
			break;

		computationSize *= 2;
	}

	// Do dummyComputations until running time seems stable enough.
	{
		const int			maxNumMeasurements							= 50;
		const int			numConsecutiveMeasurementsRequired			= 5;
		const float			relativeMedianAbsoluteDeviationThreshold	= 0.05f;
		deInt64				latestTimes[numConsecutiveMeasurementsRequired];

		for (int measurementNdx = 0;

			 measurementNdx < maxNumMeasurements &&
			 (measurementNdx < numConsecutiveMeasurementsRequired ||
			  floatRelativeMedianAbsoluteDeviation(latestTimes) > relativeMedianAbsoluteDeviationThreshold);

			 measurementNdx++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			latestTimes[measurementNdx % numConsecutiveMeasurementsRequired] = (deInt64)(deGetMicroseconds() - startTime);
		}
	}

	*warmupCPUInternal::g_dummy.m_v = dummy;
}